

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O0

void ncnn::nms_sorted_bboxes
               (vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *bboxes,
               vector<int,_std::allocator<int>_> *picked,float nms_threshold)

{
  bool bVar1;
  size_type sVar2;
  vector<float,_std::allocator<float>_> *this;
  const_reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  vector<int,_std::allocator<int>_> *in_RSI;
  BBoxRect *in_RDI;
  float in_XMM0_Da;
  float fVar6;
  float union_area;
  float inter_area;
  BBoxRect *b;
  int j;
  int keep;
  BBoxRect *a;
  int i_1;
  float height;
  float width;
  BBoxRect *r;
  int i;
  vector<float,_std::allocator<float>_> areas;
  int n;
  undefined4 in_stack_ffffffffffffff50;
  value_type in_stack_ffffffffffffff54;
  BBoxRect *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  int iVar7;
  undefined4 in_stack_ffffffffffffff6c;
  int local_70;
  int local_5c;
  int local_48;
  vector<float,_std::allocator<float>_> local_30;
  int local_18;
  float local_14;
  vector<int,_std::allocator<int>_> *local_10;
  BBoxRect *local_8;
  
  local_14 = in_XMM0_Da;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1bfc8d);
  sVar2 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::size
                    ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)local_8);
  local_18 = (int)sVar2;
  this = (vector<float,_std::allocator<float>_> *)(long)local_18;
  std::allocator<float>::allocator((allocator<float> *)0x1bfcc0);
  std::vector<float,_std::allocator<float>_>::vector
            (this,CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  std::allocator<float>::~allocator((allocator<float> *)0x1bfce6);
  for (local_48 = 0; local_48 < local_18; local_48 = local_48 + 1) {
    pvVar3 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::operator[]
                       ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)local_8,
                        (long)local_48);
    fVar6 = (pvVar3->xmax - pvVar3->xmin) * (pvVar3->ymax - pvVar3->ymin);
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&local_30,(long)local_48);
    *pvVar4 = fVar6;
  }
  for (local_5c = 0; local_5c < local_18; local_5c = local_5c + 1) {
    std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::operator[]
              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)local_8,(long)local_5c);
    bVar1 = true;
    local_70 = 0;
    while( true ) {
      iVar7 = local_70;
      sVar2 = std::vector<int,_std::allocator<int>_>::size(local_10);
      if ((int)sVar2 <= iVar7) break;
      in_stack_ffffffffffffff58 = local_8;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_10,(long)local_70);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::operator[]
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_ffffffffffffff58,(long)*pvVar5);
      fVar6 = intersection_area(in_stack_ffffffffffffff58,
                                (BBoxRect *)
                                CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      in_stack_ffffffffffffff64 = fVar6;
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&local_30,(long)local_5c);
      in_stack_ffffffffffffff54 = *pvVar4;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_10,(long)local_70);
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&local_30,(long)*pvVar5);
      if (local_14 < fVar6 / ((in_stack_ffffffffffffff54 + *pvVar4) - fVar6)) {
        bVar1 = false;
      }
      local_70 = local_70 + 1;
    }
    if (bVar1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 (value_type_conflict1 *)in_stack_ffffffffffffff58);
    }
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  return;
}

Assistant:

static void nms_sorted_bboxes(const std::vector<BBoxRect>& bboxes, std::vector<int>& picked, float nms_threshold)
{
    picked.clear();

    const int n = bboxes.size();

    std::vector<float> areas(n);
    for (int i = 0; i < n; i++)
    {
        const BBoxRect& r = bboxes[i];

        float width = r.xmax - r.xmin;
        float height = r.ymax - r.ymin;

        areas[i] = width * height;
    }

    for (int i = 0; i < n; i++)
    {
        const BBoxRect& a = bboxes[i];

        int keep = 1;
        for (int j = 0; j < (int)picked.size(); j++)
        {
            const BBoxRect& b = bboxes[picked[j]];

            // intersection over union
            float inter_area = intersection_area(a, b);
            float union_area = areas[i] + areas[picked[j]] - inter_area;
//             float IoU = inter_area / union_area
            if (inter_area / union_area > nms_threshold)
                keep = 0;
        }

        if (keep)
            picked.push_back(i);
    }
}